

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O3

void __thiscall Tree::BuildUnit(Tree *this,cmXMLWriter *xml,string *fsPath)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Tree *pTVar3;
  _Base_ptr p_Var4;
  char *__end;
  Tree *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  Tree *local_38;
  
  p_Var4 = (this->files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->files)._M_t._M_impl.super__Rb_tree_header;
  local_38 = this;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    paVar2 = &local_58.field_2;
    do {
      local_58._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Unit","");
      cmXMLWriter::StartElement(xml,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_58,fsPath,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var4 + 1));
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,"filename",&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      local_58._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Option","");
      cmXMLWriter::StartElement(xml,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      cmXMLWriter::Attribute<char[13]>(xml,"virtualFolder",(char (*) [13])"CMake Files\\");
      cmXMLWriter::EndElement(xml);
      cmXMLWriter::EndElement(xml);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  pTVar3 = (local_38->folders).super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (local_38->folders).super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pTVar3; this_00 = this_00 + 1) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"","");
    BuildUnitImpl(this_00,xml,&local_58,fsPath);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void Tree::BuildUnit(cmXMLWriter& xml, const std::string& fsPath) const
{
  for (std::string const& f : files) {
    xml.StartElement("Unit");
    xml.Attribute("filename", fsPath + f);

    xml.StartElement("Option");
    xml.Attribute("virtualFolder", "CMake Files\\");
    xml.EndElement();

    xml.EndElement();
  }
  for (Tree const& folder : folders) {
    folder.BuildUnitImpl(xml, "", fsPath);
  }
}